

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O2

uint32 leaf_mean_vars(dtree_node_t *node,pset_t *pset,float32 ****means,float32 ****vars,
                     uint32 *node_id,uint32 n_state,uint32 n_stream,uint32 *veclen,uint32 off)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  for (; (node->y != (dtree_node_t *)0x0 || (node->n != (dtree_node_str *)0x0)); node = node->n) {
    off = leaf_mean_vars(node->y,pset,means,vars,node_id,n_state,n_stream,veclen,off);
  }
  node_id[off] = node->node_id;
  for (uVar2 = 0; uVar2 != n_state; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; uVar3 != n_stream; uVar3 = uVar3 + 1) {
      uVar1 = veclen[uVar3];
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        means[off][uVar2][uVar3][uVar4] = node->means[uVar2][uVar3][uVar4];
        vars[off][uVar2][uVar3][uVar4] = node->vars[uVar2][uVar3][uVar4];
      }
    }
  }
  return off + 1;
}

Assistant:

uint32
leaf_mean_vars(dtree_node_t *node,
	       pset_t *pset,
	       float32 ****means,
	       float32 ****vars,
	       uint32 *node_id,
	       uint32 n_state,
	       uint32 n_stream,
	       uint32 *veclen,
	       uint32 off)
{
    uint32 i, j, k;

    if (IS_LEAF(node)) {
	node_id[off] = node->node_id;

	for (i = 0; i < n_state; i++) {
	    for (j = 0; j < n_stream; j++) {
		for (k = 0; k < veclen[j]; k++) {
                    means[off][i][j][k] = node->means[i][j][k];
                    vars[off][i][j][k] = node->vars[i][j][k];
		}
	    }
	}

	return ++off;
    }
    else {
	off = leaf_mean_vars(node->y,
			pset,
			means,
                        vars,
			node_id,
			n_state,
			n_stream,
			veclen,
			off);
	off = leaf_mean_vars(node->n,
			pset,
			means,
                        vars,
			node_id,
			n_state,
			n_stream,
			veclen,
			off);
	return off;
    }
}